

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall llbuild::basic::SerialQueue::async(SerialQueue *this,function<void_()> *fn)

{
  SerialQueueImpl *this_00;
  _Any_data local_30;
  _Manager_type local_20;
  
  this_00 = (SerialQueueImpl *)this->impl;
  std::function<void_()>::function((function<void_()> *)&local_30,fn);
  anon_unknown.dwarf_2f6875::SerialQueueImpl::async(this_00,(function<void_()> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void SerialQueue::async(std::function<void(void)> fn) {
  static_cast<SerialQueueImpl*>(impl)->async(fn);
}